

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageResizeCanvas(Image *image,int newWidth,int newHeight,int offsetX,int offsetY,Color fill)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  void *__dest;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_5c;
  long local_58;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar1 = image->width;
    iVar2 = image->height;
    if (iVar2 != newHeight || iVar1 != newWidth) {
      fVar6 = (float)iVar1;
      fVar8 = (float)offsetX;
      if (offsetX < 0) {
        fVar6 = fVar6 + fVar8;
        lVar4 = (long)(int)(float)-offsetX;
        fVar8 = 0.0;
      }
      else {
        if (newWidth < iVar1 + offsetX) {
          fVar6 = (float)(newWidth - offsetX);
        }
        lVar4 = 0;
      }
      fVar7 = (float)iVar2;
      local_5c = (float)offsetY;
      if (offsetY < 0) {
        fVar7 = fVar7 + local_5c;
        local_58 = (long)(int)(float)-offsetY;
        local_5c = 0.0;
      }
      else {
        if (newHeight < iVar2 + offsetY) {
          fVar7 = (float)(newHeight - offsetY);
        }
        local_58 = 0;
      }
      fVar9 = (float)newWidth;
      if (fVar6 <= (float)newWidth) {
        fVar9 = fVar6;
      }
      fVar6 = (float)newHeight;
      if (fVar7 <= (float)newHeight) {
        fVar6 = fVar7;
      }
      iVar2 = GetPixelDataSize(1,1,image->format);
      pvVar3 = calloc((long)(newHeight * newWidth * iVar2),1);
      lVar4 = (lVar4 + local_58 * iVar1) * (long)iVar2;
      __dest = (void *)((long)(((int)fVar8 + (int)local_5c * newWidth) * iVar2) + (long)pvVar3);
      for (lVar5 = 0; lVar5 < (int)fVar6; lVar5 = lVar5 + 1) {
        memcpy(__dest,(void *)((long)image->data + lVar4),(long)((int)fVar9 * iVar2));
        lVar4 = lVar4 + (long)iVar2 * (long)iVar1;
        __dest = (void *)((long)__dest + (long)(iVar2 * newWidth));
      }
      free(image->data);
      image->data = pvVar3;
      image->width = newWidth;
      image->height = newHeight;
    }
  }
  return;
}

Assistant:

void ImageResizeCanvas(Image *image, int newWidth, int newHeight, int offsetX, int offsetY, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else if ((newWidth != image->width) || (newHeight != image->height))
    {
        Rectangle srcRec = { 0, 0, (float)image->width, (float)image->height };
        Vector2 dstPos = { (float)offsetX, (float)offsetY };

        if (offsetX < 0)
        {
            srcRec.x = (float)-offsetX;
            srcRec.width += (float)offsetX;
            dstPos.x = 0;
        }
        else if ((offsetX + image->width) > newWidth) srcRec.width = (float)(newWidth - offsetX);

        if (offsetY < 0)
        {
            srcRec.y = (float)-offsetY;
            srcRec.height += (float)offsetY;
            dstPos.y = 0;
        }
        else if ((offsetY + image->height) > newHeight) srcRec.height = (float)(newHeight - offsetY);

        if (newWidth < srcRec.width) srcRec.width = (float)newWidth;
        if (newHeight < srcRec.height) srcRec.height = (float)newHeight;

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *resizedData = (unsigned char *)RL_CALLOC(newWidth*newHeight*bytesPerPixel, 1);

        // TODO: Fill resizedData with fill color (must be formatted to image->format)

        int dstOffsetSize = ((int)dstPos.y*newWidth + (int)dstPos.x)*bytesPerPixel;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            memcpy(resizedData + dstOffsetSize, ((unsigned char *)image->data) + ((y + (int)srcRec.y)*image->width + (int)srcRec.x)*bytesPerPixel, (int)srcRec.width*bytesPerPixel);
            dstOffsetSize += (newWidth*bytesPerPixel);
        }

        RL_FREE(image->data);
        image->data = resizedData;
        image->width = newWidth;
        image->height = newHeight;
    }
}